

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtest.cpp
# Opt level: O2

bool __thiscall hashtest::DoLruHashTest(hashtest *this,char **hash_input,size_t nb_input)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  size_t sVar5;
  hashTestKey *phVar6;
  size_t sVar7;
  size_t i_1;
  size_t i_2;
  char **ppcVar8;
  size_t i_3;
  size_t i;
  ulong uVar9;
  bool stored;
  hashTestKey key;
  LruHash<hashTestKey> hashTable;
  
  hashTable.binHash.tableSize = 0;
  hashTable.binHash.tableCount = 0;
  hashTable.binHash.hashBin = (hashTestKey **)0x0;
  hashTable.MostRecentlyUsed = (hashTestKey *)0x0;
  hashTable.LeastRecentlyUsed = (hashTestKey *)0x0;
  hashTable.targetSize = 0;
  bVar2 = true;
  for (uVar9 = 0; (bVar2 != false && (uVar9 < nb_input)); uVar9 = uVar9 + 1) {
    pcVar1 = hash_input[uVar9];
    sVar5 = strlen(pcVar1);
    key.count = 1;
    key.hash = 0;
    if (0xf < sVar5) {
      sVar5 = 0x10;
    }
    key.HashNext = (hashTestKey *)0x0;
    key.LessRecentKey = (hashTestKey *)0x0;
    key.MoreRecentKey = (hashTestKey *)0x0;
    key.indx = uVar9;
    memcpy(key.text,pcVar1,sVar5);
    key.text_len = (uint32_t)sVar5;
    this = (hashtest *)&hashTable;
    phVar6 = LruHash<hashTestKey>::InsertOrAdd((LruHash<hashTestKey> *)this,&key,true,&stored);
    if (uVar9 == 0x41) {
      bVar2 = LruCheck(this,&hashTable);
    }
    if ((stored & 1U) == 0) {
      bVar2 = false;
    }
    bVar3 = false;
    if (phVar6 != (hashTestKey *)0x0) {
      bVar3 = bVar2;
    }
    bVar2 = bVar3;
  }
  bVar3 = false;
  if ((ulong)hashTable.binHash._0_8_ >> 0x20 == nb_input) {
    bVar3 = bVar2;
  }
  if (bVar2 == false) {
    bVar3 = bVar2;
  }
  if (bVar3 != false) {
    bVar3 = LruCheck(this,&hashTable);
  }
  for (uVar9 = 0; (bVar3 != false && (uVar9 < nb_input)); uVar9 = uVar9 + 1) {
    pcVar1 = hash_input[uVar9];
    sVar5 = strlen(pcVar1);
    key.count = 1;
    key.hash = 0;
    if (0xf < sVar5) {
      sVar5 = 0x10;
    }
    key.HashNext = (hashTestKey *)0x0;
    key.LessRecentKey = (hashTestKey *)0x0;
    key.MoreRecentKey = (hashTestKey *)0x0;
    key.indx = uVar9;
    memcpy(key.text,pcVar1,sVar5);
    key.text_len = (uint32_t)sVar5;
    this = (hashtest *)&hashTable;
    phVar6 = LruHash<hashTestKey>::InsertOrAdd((LruHash<hashTestKey> *)this,&key,true,&stored);
    bVar2 = false;
    if (((phVar6 != (hashTestKey *)0x0) && (stored == false)) && (phVar6->count == 2)) {
      bVar2 = bVar3;
    }
    bVar3 = bVar2;
  }
  if (bVar3 != false) {
    bVar3 = LruCheck(this,&hashTable);
  }
  for (uVar9 = 0; (bVar3 != false && (uVar9 < nb_input)); uVar9 = uVar9 + 1) {
    pcVar1 = hash_input[uVar9];
    sVar5 = strlen(pcVar1);
    key.count = 1;
    key.hash = 0;
    if (0xf < sVar5) {
      sVar5 = 0x10;
    }
    key.HashNext = (hashTestKey *)0x0;
    key.LessRecentKey = (hashTestKey *)0x0;
    key.MoreRecentKey = (hashTestKey *)0x0;
    key.indx = uVar9;
    memcpy(key.text,pcVar1,sVar5);
    key.text_len = (uint32_t)sVar5;
    this = (hashtest *)&hashTable;
    phVar6 = LruHash<hashTestKey>::Retrieve((LruHash<hashTestKey> *)this,&key);
    if (phVar6 == (hashTestKey *)0x0) {
      bVar2 = false;
    }
    else {
      this = (hashtest *)&key;
      bVar4 = hashTestKey::IsSameKey((hashTestKey *)this,phVar6);
      bVar2 = false;
      if ((bVar4) && (phVar6->count == 2)) {
        bVar2 = bVar3;
      }
    }
    bVar3 = bVar2;
  }
  if (bVar3 != false) {
    bVar3 = LruCheck(this,&hashTable);
  }
  ppcVar8 = to_not_hash;
  for (uVar9 = 0; (bVar3 != false && (uVar9 < 7)); uVar9 = uVar9 + 1) {
    pcVar1 = *ppcVar8;
    sVar5 = strlen(pcVar1);
    key.count = 1;
    key.hash = 0;
    key.indx = 0xff;
    if (0xf < sVar5) {
      sVar5 = 0x10;
    }
    key.HashNext = (hashTestKey *)0x0;
    key.LessRecentKey = (hashTestKey *)0x0;
    key.MoreRecentKey = (hashTestKey *)0x0;
    memcpy(key.text,pcVar1,sVar5);
    key.text_len = (uint32_t)sVar5;
    this = (hashtest *)&hashTable;
    phVar6 = LruHash<hashTestKey>::Retrieve((LruHash<hashTestKey> *)this,&key);
    if (phVar6 != (hashTestKey *)0x0) {
      bVar3 = false;
    }
    ppcVar8 = ppcVar8 + 1;
  }
  if (bVar3 != false) {
    bVar3 = LruCheck(this,&hashTable);
  }
  if (bVar3 != false) {
    pcVar1 = hash_input[nb_input >> 1];
    sVar7 = strlen(pcVar1);
    key.count = 1;
    key.hash = 0;
    sVar5 = 0x10;
    if (sVar7 < 0x10) {
      sVar5 = sVar7;
    }
    key.HashNext = (hashTestKey *)0x0;
    key.LessRecentKey = (hashTestKey *)0x0;
    key.MoreRecentKey = (hashTestKey *)0x0;
    key.indx = nb_input >> 1;
    memcpy(key.text,pcVar1,sVar5);
    key.text_len = (uint32_t)sVar5;
    phVar6 = LruHash<hashTestKey>::Remove(&hashTable,&key);
    if (phVar6 != (hashTestKey *)0x0) {
      operator_delete(phVar6);
      nb_input = nb_input - 1;
      if (nb_input == (ulong)hashTable.binHash._0_8_ >> 0x20) {
        bVar3 = LruCheck((hashtest *)phVar6,&hashTable);
        goto LAB_00184c18;
      }
    }
    bVar3 = false;
  }
LAB_00184c18:
  while ((nb_input = nb_input - 1, bVar3 != false && (hashTable.binHash.tableCount != 0))) {
    phVar6 = LruHash<hashTestKey>::RemoveLRU(&hashTable);
    if ((phVar6 == (hashTestKey *)0x0) ||
       (operator_delete(phVar6), nb_input != (ulong)hashTable.binHash._0_8_ >> 0x20)) {
      bVar3 = false;
    }
    else {
      bVar3 = LruCheck((hashtest *)phVar6,&hashTable);
    }
  }
  LruHash<hashTestKey>::~LruHash(&hashTable);
  return bVar3;
}

Assistant:

bool hashtest::DoLruHashTest(char const ** hash_input, size_t nb_input)
{
    LruHash<hashTestKey> hashTable;
    size_t target_size = nb_input;
    bool ret = true;

    /* Enter all the data in the input table */
    for (size_t i = 0; ret && i < nb_input; i++)
    {
        hashTestKey key((uint8_t const *)hash_input[i], strlen(hash_input[i]), i);
        bool stored;

        hashTestKey * retKey = hashTable.InsertOrAdd(&key, true, &stored);

        if (i == 0x41)
        {
            ret = LruCheck((void*)&hashTable);
        }

        if (retKey == NULL)
        {
            ret = false;
        }
        else if (!stored)
        {
            ret = false;
        }
    }

    if (ret && hashTable.GetCount() != target_size)
    {
        ret = false;
    }

    if (ret)
    {
        ret = LruCheck((void*)&hashTable);
    }

    /* Verify that all the data can be rewritten without creating new entries */
    for (size_t i = 0; ret && i < nb_input; i++)
    {
        hashTestKey key((uint8_t const *)hash_input[i], strlen(hash_input[i]), i);
        bool stored;

        hashTestKey * retKey = hashTable.InsertOrAdd(&key, true, &stored);

        if (retKey == NULL)
        {
            ret = false;
        }
        else if (stored)
        {
            ret = false;
        }
        else if (retKey->count != 2)
        {
            ret = false;
        }
    }

    if (ret)
    {
        ret = LruCheck((void*)&hashTable);
    }

    /* Verify that all the data can be retrieved */
    for (size_t i = 0; ret && i < nb_input; i++)
    {
        hashTestKey key((uint8_t const *)hash_input[i], strlen(hash_input[i]), i);

        hashTestKey * retKey = hashTable.Retrieve(&key);

        if (retKey == NULL)
        {
            ret = false;
        }
        else if (!key.IsSameKey(retKey))
        {
            ret = false;
        }
        else if (retKey->count != 2)
        {
            ret = false;
        }
    }

    if (ret)
    {
        ret = LruCheck((void*)&hashTable);
    }

    /* Verify that all the non-data cannot be retrieved */
    for (size_t i = 0; ret && i < size_to_not_hash; i++)
    {
        hashTestKey key((uint8_t const *)to_not_hash[i], strlen(to_not_hash[i]), 0xFF);

        hashTestKey * retKey = hashTable.Retrieve(&key);

        if (retKey != NULL)
        {
            ret = false;
        }
    }

    /* Check that the LRU Hash order is correct -- should be same as table order */

    if (ret)
    {
        ret = LruCheck((void*)&hashTable);
    }

    /* Delete some random object, then check the table */
    if (ret)
    {
        size_t i = nb_input / 2;
        hashTestKey key((uint8_t const *)hash_input[i], strlen(hash_input[i]), i);
        hashTestKey * retKey = hashTable.Remove(&key);

        if (retKey == NULL)
        {
            ret = false;
        }
        else
        {
            delete retKey;
            target_size--;

            if (hashTable.GetCount() != target_size)
            {
                ret = false;
            }
            else
            {
                ret = LruCheck((void*)&hashTable);
            }     
        }
    }

    /* Delete the LRU object, then check the table */
    while (ret && hashTable.GetCount() > 0)
    {
        hashTestKey * retKey = hashTable.RemoveLRU();
        target_size--;

        if (retKey == NULL)
        {
            ret = false;
        }
        else
        {
            delete retKey;

            if (hashTable.GetCount() != target_size)
            {
                ret = false;
            }
            else
            {
                ret = LruCheck((void*)&hashTable);
            }
        }
    }
    return ret;
}